

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

void __thiscall QLineEditPrivate::removeAction(QLineEditPrivate *this,QAction *action)

{
  undefined8 *puVar1;
  long *plVar2;
  uint uVar3;
  QWidget *this_00;
  long lVar4;
  undefined8 *puVar5;
  QWidget *widget;
  void **ppvVar6;
  SideWidgetLocation SVar7;
  ulong uVar8;
  QWidgetAction *this_01;
  undefined4 *puVar9;
  undefined8 *__src;
  ulong uVar10;
  long lVar11;
  long in_FS_OFFSET;
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  SVar7 = findSideWidget(this,action);
  if (-1 < (long)SVar7) {
    uVar8 = (ulong)SVar7 >> 0x20;
    lVar11 = 0x2c0;
    if (SVar7.position == TrailingPosition) {
      lVar11 = 0x2d8;
    }
    lVar4 = *(long *)(&(this->super_QWidgetPrivate).super_QObjectPrivate + lVar11);
    puVar5 = *(undefined8 **)(&(this->super_QWidgetPrivate).field_0x8 + lVar11);
    uVar10 = ((long)puVar5 - lVar4 >> 3) * -0x5555555555555555;
    if (uVar10 < uVar8 || uVar10 - uVar8 == 0) {
      removeAction();
      goto LAB_004293f8;
    }
    puVar1 = (undefined8 *)(lVar4 + uVar8 * 0x18);
    __src = puVar1 + 3;
    widget = (QWidget *)*puVar1;
    uVar3 = *(uint *)(puVar1 + 2);
    if (__src != puVar5) {
      memmove((void *)(lVar4 + uVar8 * 0x18),__src,(long)puVar5 - (long)__src);
    }
    plVar2 = (long *)(&(this->super_QWidgetPrivate).field_0x8 + lVar11);
    *plVar2 = *plVar2 + -0x18;
    if ((uVar3 & 2) == 0) {
      if (widget != (QWidget *)0x0) {
        (**(code **)(*(long *)widget + 0x20))(widget);
      }
    }
    else {
      this_01 = (QWidgetAction *)QMetaObject::cast((QObject *)&QWidgetAction::staticMetaObject);
      if (this_01 != (QWidgetAction *)0x0) {
        QWidgetAction::releaseWidget(this_01,widget);
      }
    }
    positionSideWidgets(this);
    if (((this->leadingSideWidgets).
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->leadingSideWidgets).
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((this->trailingSideWidgets).
        super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->trailingSideWidgets).
        super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_48 = QLineEdit::textChanged;
      local_40 = 0;
      local_58 = textChanged;
      local_50 = (ImplFn)0x0;
      ppvVar6 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
      puVar9 = (undefined4 *)operator_new(0x20);
      *puVar9 = 1;
      *(code **)(puVar9 + 2) =
           QtPrivate::
           QPrivateSlotObject<void_(QLineEditPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
           ::impl;
      *(code **)(puVar9 + 4) = textChanged;
      *(undefined8 *)(puVar9 + 6) = 0;
      QObject::connectImpl
                (local_60,(void **)this_00,(QObject *)&local_48,ppvVar6,(QSlotObjectBase *)&local_58
                 ,(ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_60);
    }
    QWidget::update(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004293f8:
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::removeAction(QAction *action)
{
    Q_Q(QLineEdit);
    const auto location = findSideWidget(action);
    if (!location.isValid())
        return;
    SideWidgetEntryList &list = location.position == QLineEdit::TrailingPosition ? trailingSideWidgets : leadingSideWidgets;
    SideWidgetEntry entry = list[location.index];
    list.erase(list.begin() + location.index);
    if (entry.flags & SideWidgetCreatedByWidgetAction) {
        // If the cast fails, the QAction is in the process of being deleted
        // and has already ceased to be a QWidgetAction; in the process, it
        // will release its widget itself, and calling releaseWidget() here
        // would be UB, so don't:
        if (const auto a = qobject_cast<QWidgetAction*>(entry.action))
            a->releaseWidget(entry.widget);
    } else {
         delete entry.widget;
    }
     positionSideWidgets();
     if (!hasSideWidgets()) // Last widget, remove connection
         QObjectPrivate::connect(q, &QLineEdit::textChanged,
                                 this, &QLineEditPrivate::textChanged);
     q->update();
}